

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtilities.cpp
# Opt level: O1

double Js::DateUtilities::DblModPos(double dbl,double dblDen)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dVar4;
  
  if (dblDen <= 0.0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/DateUtilities.cpp"
                                ,0xa7,"(dblDen > 0)","value not positive");
    if (!bVar2) goto LAB_006837cf;
    *puVar3 = 0;
  }
  dVar4 = fmod(dbl,dblDen);
  dVar4 = (double)(~-(ulong)(dVar4 < 0.0) & (ulong)dVar4 |
                  (ulong)(dVar4 + dblDen) & -(ulong)(dVar4 < 0.0));
  if ((dVar4 < 0.0) || (dblDen <= dVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/DateUtilities.cpp"
                                ,0xad,"(dbl >= 0 && dbl < dblDen)","");
    if (!bVar2) {
LAB_006837cf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return dVar4;
}

Assistant:

double
    DateUtilities::DblModPos(double dbl, double dblDen)
    {
        AssertMsg(dblDen > 0, "value not positive");
        dbl = fmod(dbl, dblDen);
        if (dbl < 0)
        {
            dbl += dblDen;
        }
        AssertMsg(dbl >= 0 && dbl < dblDen, "");
        return dbl;
    }